

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

void OpenBreakpointsFile(path *filename,EBreakpointsFile type)

{
  pointer pcVar1;
  char cVar2;
  long *local_38 [2];
  long local_28 [2];
  
  cVar2 = std::filesystem::__cxx11::path::has_filename();
  if (cVar2 == '\0') {
    pcVar1 = (filename->_M_pathname)._M_dataplus._M_p;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,pcVar1,pcVar1 + (filename->_M_pathname)._M_string_length);
    Error("empty filename",(char *)local_38[0],EARLY);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  else {
    if (FP_BreakpointsFile != (FILE *)0x0) {
      Error("breakpoints file was already opened",(char *)0x0,EARLY);
      return;
    }
    FP_BreakpointsFile = SJ_fopen(filename,"w");
    if (FP_BreakpointsFile == (FILE *)0x0) {
      pcVar1 = (filename->_M_pathname)._M_dataplus._M_p;
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,pcVar1,pcVar1 + (filename->_M_pathname)._M_string_length);
      Error("opening file for write",(char *)local_38[0],EARLY);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
    }
    breakpointsCounter = 0;
    breakpointsType = type;
  }
  return;
}

Assistant:

void OpenBreakpointsFile(const std::filesystem::path & filename, const EBreakpointsFile type) {
	if (!filename.has_filename()) {
		Error("empty filename", filename.string().c_str(), EARLY);
		return;
	}
	if (FP_BreakpointsFile) {
		Error("breakpoints file was already opened", nullptr, EARLY);
		return;
	}
	if (!FOPEN_ISOK(FP_BreakpointsFile, filename, "w")) {
		Error("opening file for write", filename.string().c_str(), EARLY);
	}
	breakpointsCounter = 0;
	breakpointsType = type;
}